

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall
Omega_h::Write<long>::Write(Write<long> *this,LO size_in,long offset,long stride,string *name_in)

{
  Write<long> local_40;
  string *local_30;
  string *name_in_local;
  long stride_local;
  long offset_local;
  Write<long> *pWStack_10;
  LO size_in_local;
  Write<long> *this_local;
  
  local_30 = name_in;
  name_in_local = (string *)stride;
  stride_local = offset;
  offset_local._4_4_ = size_in;
  pWStack_10 = this;
  Write(this,size_in,name_in);
  Write(&local_40,(Write<int> *)this);
  fill_linear<long>(&local_40,stride_local,(long)name_in_local);
  ~Write(&local_40);
  return;
}

Assistant:

Write<T>::Write(LO size_in, T offset, T stride, std::string const& name_in)
    : Write<T>(size_in, name_in) {
  fill_linear(*this, offset, stride);
}